

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

void __thiscall TiXmlText::Print(TiXmlText *this,FILE *cfile,int depth)

{
  TiXmlString buffer;
  TiXmlString local_28;
  
  if (cfile == (FILE *)0x0) {
    __assert_fail("cfile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                  ,0x536,"virtual void TiXmlText::Print(FILE *, int) const");
  }
  if (this->cdata != true) {
    local_28.rep_ = &TiXmlString::nullrep_;
    TiXmlBase::EncodeString(&(this->super_TiXmlNode).value,&local_28);
    fputs((local_28.rep_)->str,(FILE *)cfile);
    if (local_28.rep_ != (Rep *)0x0 && local_28.rep_ != &TiXmlString::nullrep_) {
      operator_delete__(local_28.rep_);
    }
    return;
  }
  fputc(10,(FILE *)cfile);
  if (0 < depth) {
    do {
      fwrite("    ",4,1,(FILE *)cfile);
      depth = depth + -1;
    } while (depth != 0);
  }
  fprintf((FILE *)cfile,"<![CDATA[%s]]>\n",((this->super_TiXmlNode).value.rep_)->str);
  return;
}

Assistant:

void TiXmlText::Print( FILE* cfile, int depth ) const
{
	assert( cfile );
	if ( cdata )
	{
		int i;
		fprintf( cfile, "\n" );
		for ( i=0; i<depth; i++ ) {
			fprintf( cfile, "    " );
		}
		fprintf( cfile, "<![CDATA[%s]]>\n", value.c_str() );	// unformatted output
	}
	else
	{
		TIXML_STRING buffer;
		EncodeString( value, &buffer );
		fprintf( cfile, "%s", buffer.c_str() );
	}
}